

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa_milo.h
# Opt level: O1

void Grisu2(double value,char *buffer,int *length,int *K)

{
  long lVar1;
  ulong uVar2;
  double dVar3;
  uint uVar4;
  int iVar5;
  DiyFp DVar6;
  DiyFp w_p;
  DiyFp w_m;
  DiyFp local_90;
  DiyFp local_80;
  DiyFp local_70;
  DiyFp local_60;
  DiyFp local_50;
  DiyFp local_40;
  
  local_90.f = (ulong)value & 0xfffffffffffff;
  if (((ulong)value >> 0x34 & 0x7ff) == 0) {
    local_90.e = -0x432;
  }
  else {
    local_90.f = local_90.f + 0x10000000000000;
    local_90.e = ((uint)((ulong)value >> 0x34) & 0x7ff) - 0x433;
  }
  DiyFp::NormalizedBoundaries(&local_90,&local_60,&local_70);
  dVar3 = (double)(-0x3d - local_70.e) * 0.30102999566398114 + 347.0;
  iVar5 = (int)((uint)((double)(int)dVar3 < dVar3) + (int)dVar3) >> 3;
  uVar4 = iVar5 + 1;
  *K = 0x15c - (iVar5 * 8 + 8);
  if (uVar4 < 0x57) {
    local_40.f = *(uint64_t *)(GetCachedPower(int,int*)::kCachedPowers_F + (ulong)uVar4 * 8);
    local_40.e = (int)*(short *)(GetCachedPower(int,int*)::kCachedPowers_E + (ulong)uVar4 * 2);
    uVar2 = 0x3f;
    if (local_90.f != 0) {
      for (; local_90.f >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    local_80.f = local_90.f << ((byte)(uVar2 ^ 0x3f) & 0x3f);
    local_80.e = local_90.e - (int)(uVar2 ^ 0x3f);
    DVar6 = DiyFp::operator*(&local_80,&local_40);
    local_50.f = DVar6.f;
    local_50.e = DVar6.e;
    DVar6 = DiyFp::operator*(&local_70,&local_40);
    local_80.f = DVar6.f;
    local_80.e = DVar6.e;
    DVar6 = DiyFp::operator*(&local_60,&local_40);
    lVar1 = local_80.f - 1;
    local_80.f = local_80.f - 1;
    DigitGen(&local_50,&local_80,lVar1 + ~DVar6.f,buffer,length,K);
    return;
  }
  __assert_fail("index < sizeof(kCachedPowers_F) / sizeof(kCachedPowers_F[0])",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/dtoa_milo.h"
                ,0xda,"DiyFp GetCachedPower(int, int *)");
}

Assistant:

inline void Grisu2(double value, char* buffer, int* length, int* K) {
	const DiyFp v(value);
	DiyFp w_m, w_p;
	v.NormalizedBoundaries(&w_m, &w_p);

	const DiyFp c_mk = GetCachedPower(w_p.e, K);
	const DiyFp W = v.Normalize() * c_mk;
	DiyFp Wp = w_p * c_mk;
	DiyFp Wm = w_m * c_mk;
	Wm.f++;
	Wp.f--;
	DigitGen(W, Wp, Wp.f - Wm.f, buffer, length, K);
}